

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

void __thiscall
slang::syntax::SyntaxVisitor<no_dot_var_in_port_connection::PortConnectionVisitor>::
visitDefault<slang::syntax::DotMemberClauseSyntax_const&>
          (SyntaxVisitor<no_dot_var_in_port_connection::PortConnectionVisitor> *this,
          DotMemberClauseSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  uint uVar2;
  ulong index;
  
  uVar2 = 0;
  while( true ) {
    index = (ulong)uVar2;
    sVar1 = SyntaxNode::getChildCount(&node->super_SyntaxNode);
    if (sVar1 <= index) break;
    node_00 = SyntaxNode::childNode(&node->super_SyntaxNode,index);
    if (node_00 == (SyntaxNode *)0x0) {
      SyntaxNode::childToken(&node->super_SyntaxNode,index);
    }
    else {
      detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,no_dot_var_in_port_connection::PortConnectionVisitor>
                (node_00,(PortConnectionVisitor *)this);
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }